

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void __thiscall Js::Profiler::Suspend(Profiler *this,Phase tag,SuspendRecord *suspendRecord)

{
  Phase profileTag;
  uint uVar1;
  TimeEntry *pTVar2;
  TimeStamp curTime;
  TimeEntry curEntry;
  TimeEntry local_38;
  Phase local_22;
  SuspendRecord *pSStack_20;
  Phase topTag;
  SuspendRecord *suspendRecord_local;
  Profiler *pPStack_10;
  Phase tag_local;
  Profiler *this_local;
  
  suspendRecord->count = 0;
  pSStack_20 = suspendRecord;
  suspendRecord_local._6_2_ = tag;
  pPStack_10 = this;
  do {
    pTVar2 = FixedStack<Js::TimeEntry,_20>::Peek(&this->timeStack);
    profileTag = pTVar2->tag;
    local_22 = profileTag;
    curTime = GetTime();
    TimeEntry::TimeEntry(&local_38,profileTag,curTime);
    curEntry._2_6_ = 0;
    curEntry.tag = local_38.tag;
    curEntry.time = local_38.time;
    Pop(this,curEntry);
    uVar1 = pSStack_20->count;
    pSStack_20->count = uVar1 + 1;
    pSStack_20->phase[uVar1] = local_22;
  } while (local_22 != suspendRecord_local._6_2_);
  return;
}

Assistant:

void
    Profiler::Suspend(Phase tag, SuspendRecord * suspendRecord)
    {
        suspendRecord->count = 0;
        Phase topTag;
        do
        {
            topTag = timeStack.Peek()->tag;
            Pop(TimeEntry(topTag, GetTime()));
            suspendRecord->phase[suspendRecord->count++] = topTag;
        } while(topTag != tag);
    }